

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::sectionEnded(RunContext *this,SectionEndInfo *endInfo)

{
  bool bVar1;
  reference ppIVar2;
  pointer pIVar3;
  SectionStats local_b8;
  byte local_31;
  undefined1 local_30 [7];
  bool missingAssertions;
  Counts assertions;
  SectionEndInfo *endInfo_local;
  RunContext *this_local;
  
  assertions.failedButOk = (size_t)endInfo;
  Counts::operator-((Counts *)local_30,&(this->m_totals).assertions,&endInfo->prevAssertions);
  local_31 = testForMissingAssertions(this,(Counts *)local_30);
  bVar1 = clara::std::
          vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
          ::empty(&this->m_activeSections);
  if (!bVar1) {
    ppIVar2 = clara::std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back(&this->m_activeSections);
    (*(*ppIVar2)->_vptr_ITracker[8])();
    clara::std::
    vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ::pop_back(&this->m_activeSections);
  }
  pIVar3 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  SectionStats::SectionStats
            (&local_b8,(SectionInfo *)assertions.failedButOk,(Counts *)local_30,
             *(double *)(assertions.failedButOk + 0x68),(bool)(local_31 & 1));
  (*pIVar3->_vptr_IStreamingReporter[0xb])(pIVar3,&local_b8);
  SectionStats::~SectionStats(&local_b8);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            (&this->m_messages);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            (&this->m_messageScopes);
  return;
}

Assistant:

void RunContext::sectionEnded(SectionEndInfo const &endInfo) {
    Counts assertions = m_totals.assertions - endInfo.prevAssertions;
    bool missingAssertions = testForMissingAssertions(assertions);

    if (!m_activeSections.empty()) {
      m_activeSections.back()->close();
      m_activeSections.pop_back();
    }

    m_reporter->sectionEnded(SectionStats(endInfo.sectionInfo, assertions, endInfo.durationInSeconds, missingAssertions));
    m_messages.clear();
    m_messageScopes.clear();
  }